

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O3

void Imf_2_5::offsetInLineBufferTable
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine,int scanline1,
               int scanline2,int linesInLineBuffer,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *offsetInLineBuffer)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  long lVar5;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (offsetInLineBuffer,
             (long)(bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (scanline1 <= scanline2) {
    puVar1 = (offsetInLineBuffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar3 = 0;
      if ((scanline1 + (int)lVar5) % linesInLineBuffer != 0) {
        uVar3 = uVar4;
      }
      puVar1[scanline1 + lVar5] = uVar3;
      uVar4 = uVar3 + puVar2[scanline1 + lVar5];
      lVar5 = lVar5 + 1;
    } while (~scanline2 + scanline1 + (int)lVar5 != 0);
  }
  return;
}

Assistant:

void
offsetInLineBufferTable (const vector<size_t> &bytesPerLine,
                         int scanline1, int scanline2,
                         int linesInLineBuffer,
                         vector<size_t> &offsetInLineBuffer)
{
    offsetInLineBuffer.resize (bytesPerLine.size());

    size_t offset = 0;

    for (int i = scanline1; i <= scanline2; ++i)
    {
        if (i % linesInLineBuffer == 0)
            offset = 0;

        offsetInLineBuffer[i] = offset;
        offset += bytesPerLine[i];
    }
}